

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_Packetizer.cpp
# Opt level: O3

size_t __thiscall axl::sl::PacketizerRoot::writeImpl(PacketizerRoot *this,void *p0,size_t size0)

{
  char cVar1;
  char *pcVar2;
  ulong count;
  ulong uVar3;
  ulong count_00;
  size_t sVar4;
  ulong uVar5;
  bool bVar6;
  
  uVar5 = (this->m_buffer).super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>.m_count;
  count_00 = size0;
  while (uVar5 < 4) {
    bVar6 = count_00 == 0;
    count_00 = count_00 - 1;
    if (bVar6) {
      return 0xffffffffffffffff;
    }
    cVar1 = *p0;
    if (cVar1 == *(char *)((long)&writeImpl::signatureBuffer + uVar5)) {
      sVar4 = (this->m_buffer).super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>.m_count;
      bVar6 = Array<char,_axl::sl::ArrayDetails<char>_>::
              setCountImpl<axl::sl::SimpleArrayDetails<char>::Construct>(&this->m_buffer,sVar4 + 1);
      if ((bVar6) &&
         (pcVar2 = (this->m_buffer).super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>.m_p,
         pcVar2 != (char *)0x0)) {
        pcVar2[sVar4] = cVar1;
      }
      uVar5 = uVar5 + 1;
    }
    else if (uVar5 == 0) {
      uVar5 = 0;
    }
    else {
      Array<char,_axl::sl::ArrayDetails<char>_>::
      setCountImpl<axl::sl::SimpleArrayDetails<char>::Construct>(&this->m_buffer,0);
      uVar5 = 0;
      if (cVar1 == '\x02') {
        uVar5 = 1;
        bVar6 = Array<char,_axl::sl::ArrayDetails<char>_>::
                setCountImpl<axl::sl::SimpleArrayDetails<char>::Construct>(&this->m_buffer,1);
        if (bVar6) {
          *(this->m_buffer).super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>.m_p = '\x02';
        }
      }
    }
    p0 = (void *)((long)p0 + 1);
  }
  if (uVar5 < 8) {
    uVar3 = 8 - uVar5;
    if (uVar3 <= count_00) {
      Array<char,_axl::sl::ArrayDetails<char>_>::insert
                (&this->m_buffer,0xffffffffffffffff,(char *)p0,uVar3);
      p0 = (void *)((long)p0 + uVar3);
      uVar5 = 8;
      count_00 = count_00 - uVar3;
      goto LAB_0011b188;
    }
LAB_0011b1b7:
    sVar4 = 0xffffffffffffffff;
    Array<char,_axl::sl::ArrayDetails<char>_>::insert
              (&this->m_buffer,0xffffffffffffffff,(char *)p0,count_00);
  }
  else {
LAB_0011b188:
    uVar3 = (ulong)(*(int *)((this->m_buffer).super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>.m_p
                            + 4) + 8);
    count = uVar3 - uVar5;
    if (uVar5 <= uVar3 && count != 0) {
      if (count_00 < count) goto LAB_0011b1b7;
      Array<char,_axl::sl::ArrayDetails<char>_>::insert
                (&this->m_buffer,0xffffffffffffffff,(char *)p0,count);
      count_00 = count_00 - count;
    }
    sVar4 = size0 - count_00;
  }
  return sVar4;
}

Assistant:

size_t
PacketizerRoot::writeImpl(
	const void* p0,
	size_t size0
) {
	const char* p = (char*)p0;
	size_t size = size0;
	size_t bufferSize = m_buffer.getCount();

	static uint32_t signatureBuffer = PacketHdrSignature;
	const char* signature = (char*)&signatureBuffer;

	while (bufferSize < sizeof(uint32_t)) { // append signature byte-by-byte
		if (!size)
			return -1; // all is buffered

		char c = *p;

		if (c == signature[bufferSize]) {
			m_buffer.append(c);
			bufferSize++;
		} else if (bufferSize) {
			m_buffer.clear();
			bufferSize = 0;

			if (c == signature[0]) {
				m_buffer.copy(c);
				bufferSize = 1;
			}
		}

		p++;
		size--;
	}

	if (bufferSize < sizeof(uint64_t)) { // packet size
		size_t chunkSize = sizeof(uint64_t) - bufferSize;
		if (size < chunkSize) {
			m_buffer.append(p, size);
			return -1; // all is buffered
		}

		m_buffer.append(p, chunkSize);
		p += chunkSize;
		size -= chunkSize;

		bufferSize = sizeof(uint64_t);
	}

	uint32_t dataSize = ((const uint32_t*)m_buffer.cp()) [1];
	uint32_t packetSize = sizeof(uint64_t) + dataSize;

	if (bufferSize < packetSize) {
		size_t chunkSize = packetSize - bufferSize;
		if (size < chunkSize) {
			m_buffer.append(p, size);
			return -1; // all is buffered
		}

		m_buffer.append(p, chunkSize);
		p += chunkSize;
		size -= chunkSize;
	}

	ASSERT(size0 >= size);
	return size0 - size;
}